

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O0

void insertion_sort<8u>(Cacheblock<8U>_conflict *cache,int n,size_t depth)

{
  uchar *puVar1;
  bool bVar2;
  uchar *tmp;
  uchar *t;
  uchar *s;
  Cacheblock<8U>_conflict *pj;
  Cacheblock<8U>_conflict *pi;
  size_t depth_local;
  int n_local;
  Cacheblock<8U>_conflict *cache_local;
  
  pj = cache + 1;
  depth_local._4_4_ = n;
  do {
    depth_local._4_4_ = depth_local._4_4_ + -1;
    if (depth_local._4_4_ < 1) {
      return;
    }
    puVar1 = pj->ptr;
    for (s = (uchar *)pj; cache < s; s = s + -0x10) {
      t = (uchar *)(*(long *)(s + -8) + depth);
      tmp = puVar1 + depth;
      while( true ) {
        bVar2 = false;
        if (*t == *tmp) {
          bVar2 = *t != '\0';
        }
        if (!bVar2) break;
        t = t + 1;
        tmp = tmp + 1;
      }
      if (*t <= *tmp) break;
      *(undefined8 *)(s + 8) = *(undefined8 *)(s + -8);
    }
    *(uchar **)(s + 8) = puVar1;
    pj = pj + 1;
  } while( true );
}

Assistant:

static inline void
insertion_sort(Cacheblock<CachedChars>* cache, int n, size_t depth)
{
	Cacheblock<CachedChars> *pi, *pj;
	unsigned char *s, *t;
	for (pi = cache + 1; --n > 0; ++pi) {
		unsigned char* tmp = pi->ptr;
		for (pj = pi; pj > cache; --pj) {
			for (s=(pj-1)->ptr+depth, t=tmp+depth; *s==*t && *s!=0;
					++s, ++t)
				;
			if (*s <= *t)
				break;
			pj->ptr = (pj-1)->ptr;
		}
		pj->ptr = tmp;
	}
}